

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSingleLumpFont::CheckFON1Chars(FSingleLumpFont *this,double *luminosity)

{
  int width;
  int height;
  CharData *pCVar1;
  uint uVar2;
  FFontChar2 *this_00;
  FResourceLump **ppFVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  FResourceLump **ppFVar9;
  int iVar10;
  LumpRecord *pLVar11;
  FMemLump memLump;
  BYTE used [256];
  BYTE reverse [256];
  undefined1 local_250 [16];
  LumpRecord *local_240;
  char local_238 [256];
  byte local_138 [264];
  
  local_250._8_8_ = luminosity;
  FWadCollection::ReadLump((FWadCollection *)local_250,0x1c74350);
  pLVar11 = (LumpRecord *)0x0;
  local_240 = (LumpRecord *)local_250._0_8_;
  if (*(int *)(local_250._0_8_ + -0xc) == 0) {
    local_240 = pLVar11;
  }
  memset(local_238,0,0x100);
  ppFVar9 = (FResourceLump **)((long)local_240 + 8);
  do {
    width = (this->super_FFont).SpaceWidth;
    height = (this->super_FFont).FontHeight;
    iVar10 = height * width;
    if ((this->super_FFont).Chars[(long)pLVar11].Pic == (FTexture *)0x0) {
      this_00 = (FFontChar2 *)operator_new(0x78);
      FFontChar2::FFontChar2
                (this_00,(this->super_FFont).Lump,(int)ppFVar9 - (int)local_240,width,height,0,0);
      pCVar1 = (this->super_FFont).Chars;
      pCVar1[(long)pLVar11].Pic = (FTexture *)this_00;
      pCVar1[(long)pLVar11].XMove = (this->super_FFont).SpaceWidth;
    }
    do {
      ppFVar3 = (FResourceLump **)((long)ppFVar9 + 1);
      uVar2 = (uint)(char)*(byte *)ppFVar9;
      if ((char)*(byte *)ppFVar9 < '\0') {
        ppFVar3 = (FResourceLump **)((long)ppFVar9 + 2);
        local_238[*(byte *)((long)ppFVar9 + 1)] = '\x01';
        iVar10 = iVar10 + uVar2 + -1;
      }
      else {
        uVar6 = uVar2 + 1;
        do {
          bVar5 = *(byte *)ppFVar3;
          ppFVar3 = (FResourceLump **)((long)ppFVar3 + 1);
          local_238[bVar5] = '\x01';
          bVar5 = (char)uVar6 - 1;
          uVar6 = (uint)bVar5;
        } while ('\0' < (char)bVar5);
        iVar10 = iVar10 + ~uVar2;
      }
      ppFVar9 = ppFVar3;
    } while (0 < iVar10);
    pLVar11 = (LumpRecord *)((long)&pLVar11->wadnum + 1);
  } while (pLVar11 != (LumpRecord *)0x100);
  memset((this->super_FFont).PatchRemap,0,0x100);
  local_138[0] = 0;
  uVar2 = 1;
  lVar4 = 1;
  do {
    if (local_238[lVar4] != '\0') {
      lVar7 = (long)(int)uVar2;
      uVar2 = uVar2 + 1;
      local_138[lVar7] = (byte)lVar4;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  if (1 < (int)uVar2) {
    uVar8 = 1;
    do {
      bVar5 = local_138[uVar8];
      (this->super_FFont).PatchRemap[bVar5] = (BYTE)uVar8;
      *(double *)(local_250._8_8_ + uVar8 * 8) = (double)(int)(bVar5 - 1) / 254.0;
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  (this->super_FFont).ActiveColors = uVar2;
  FMemLump::~FMemLump((FMemLump *)local_250);
  return;
}

Assistant:

void FSingleLumpFont::CheckFON1Chars (double *luminosity)
{
	FMemLump memLump = Wads.ReadLump(Lump);
	const BYTE* data = (const BYTE*) memLump.GetMem();

	BYTE used[256], reverse[256];
	const BYTE *data_p;
	int i, j;

	memset (used, 0, 256);
	data_p = data + 8;

	for (i = 0; i < 256; ++i)
	{
		int destSize = SpaceWidth * FontHeight;

		if(!Chars[i].Pic)
		{
			Chars[i].Pic = new FFontChar2 (Lump, int(data_p - data), SpaceWidth, FontHeight);
			Chars[i].XMove = SpaceWidth;
		}

		// Advance to next char's data and count the used colors.
		do
		{
			SBYTE code = *data_p++;
			if (code >= 0)
			{
				destSize -= code+1;
				while (code-- >= 0)
				{
					used[*data_p++] = 1;
				}
			}
			else if (code != -128)
			{
				used[*data_p++] = 1;
				destSize -= 1 - code;
			}
		} while (destSize > 0);
	}

	memset (PatchRemap, 0, 256);
	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; ++i)
	{
		if (used[i])
		{
			reverse[j++] = i;
		}
	}
	for (i = 1; i < j; ++i)
	{
		PatchRemap[reverse[i]] = i;
		luminosity[i] = (reverse[i] - 1) / 254.0;
	}
	ActiveColors = j;
}